

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

void benchmark::anon_unknown_1::InitializeSystemInfo(void)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  char *pcVar4;
  long lVar5;
  double dVar6;
  long cpu_id;
  char *freqstr_2;
  char *freqstr_1;
  char *freqstr;
  CheckHandler local_480;
  size_t local_478;
  size_t bytes_to_read;
  size_t linelen;
  char *newline;
  size_t oldlinelen;
  size_t chars_read;
  long lStack_448;
  int num_cpus;
  long max_cpu_id;
  double dStack_438;
  bool saw_bogo;
  double bogo_clock;
  char *pcStack_428;
  int fd;
  char *pname;
  long lStack_418;
  bool saw_mhz;
  long freq;
  char *err;
  char line [1024];
  
  pname._7_1_ = 0;
  bVar1 = ReadIntFromFile("/sys/devices/system/cpu/cpu0/tsc_freq_khz",&stack0xfffffffffffffbe8);
  if (bVar1) {
    (anonymous_namespace)::cpuinfo_cycles_per_second = (double)lStack_418 * 1000.0;
    pname._7_1_ = 1;
  }
  if (((pname._7_1_ & 1) == 0) &&
     (bVar1 = ReadIntFromFile("/sys/devices/system/cpu/cpu0/cpufreq/cpuinfo_max_freq",
                              &stack0xfffffffffffffbe8), bVar1)) {
    (anonymous_namespace)::cpuinfo_cycles_per_second = (double)lStack_418 * 1000.0;
    pname._7_1_ = 1;
  }
  pcStack_428 = "/proc/cpuinfo";
  bogo_clock._4_4_ = open("/proc/cpuinfo",0);
  if (bogo_clock._4_4_ == -1) {
    perror(pcStack_428);
    if ((pname._7_1_ & 1) == 0) {
      iVar3 = EstimateCyclesPerSecond();
      (anonymous_namespace)::cpuinfo_cycles_per_second = (double)iVar3;
    }
  }
  else {
    dStack_438 = 1.0;
    max_cpu_id._7_1_ = 0;
    lStack_448 = 0;
    chars_read._4_4_ = 0;
    err._1_1_ = 0;
    err._0_1_ = 0;
    oldlinelen = 0;
    do {
      newline = (char *)strlen((char *)&err);
      if (newline == (char *)0x3ff) {
        err._0_1_ = 0;
      }
      else {
        memmove(&err,newline + (long)&err + 1,0x400 - (long)(newline + 1));
      }
      linelen = (size_t)strchr((char *)&err,10);
      if ((char *)linelen == (char *)0x0) {
        bytes_to_read = strlen((char *)&err);
        local_478 = 0x3ff - bytes_to_read;
        if (local_478 == 0) {
          internal::CheckHandler::CheckHandler
                    (&local_480,"bytes_to_read > 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/sysinfo.cc"
                     ,"InitializeSystemInfo",0x99);
          internal::CheckHandler::GetLog(&local_480);
          internal::CheckHandler::~CheckHandler(&local_480);
        }
        internal::GetNullLogInstance();
        oldlinelen = read(bogo_clock._4_4_,line + (bytes_to_read - 8),local_478);
        line[bytes_to_read + oldlinelen + -8] = '\0';
        linelen = (size_t)strchr((char *)&err,10);
      }
      if (linelen != 0) {
        *(undefined1 *)linelen = 0;
      }
      if (((pname._7_1_ & 1) == 0) && (iVar2 = strncasecmp((char *)&err,"cpu MHz",7), iVar2 == 0)) {
        pcVar4 = strchr((char *)&err,0x3a);
        if (pcVar4 != (char *)0x0) {
          dVar6 = strtod(pcVar4 + 1,(char **)&freq);
          (anonymous_namespace)::cpuinfo_cycles_per_second = dVar6 * 1000000.0;
          if (((pcVar4[1] != '\0') && (*(char *)freq == '\0')) &&
             (0.0 < (anonymous_namespace)::cpuinfo_cycles_per_second)) {
            pname._7_1_ = 1;
          }
        }
      }
      else {
        iVar2 = strncasecmp((char *)&err,"bogomips",8);
        if (iVar2 == 0) {
          pcVar4 = strchr((char *)&err,0x3a);
          if (pcVar4 != (char *)0x0) {
            dStack_438 = strtod(pcVar4 + 1,(char **)&freq);
            dStack_438 = dStack_438 * 1000000.0;
            if (((pcVar4[1] != '\0') && (*(char *)freq == '\0')) && (0.0 < dStack_438)) {
              max_cpu_id._7_1_ = 1;
            }
          }
        }
        else {
          iVar2 = strncasecmp((char *)&err,"processor",9);
          if (iVar2 == 0) {
            chars_read._4_4_ = chars_read._4_4_ + 1;
            pcVar4 = strchr((char *)&err,0x3a);
            if ((((pcVar4 != (char *)0x0) &&
                 (lVar5 = strtol(pcVar4 + 1,(char **)&freq,10), pcVar4[1] != '\0')) &&
                (*(char *)freq == '\0')) && (lStack_448 < lVar5)) {
              lStack_448 = lVar5;
            }
          }
        }
      }
    } while (oldlinelen != 0);
    close(bogo_clock._4_4_);
    if ((pname._7_1_ & 1) == 0) {
      if ((max_cpu_id._7_1_ & 1) == 0) {
        iVar3 = EstimateCyclesPerSecond();
        (anonymous_namespace)::cpuinfo_cycles_per_second = (double)iVar3;
      }
      else {
        (anonymous_namespace)::cpuinfo_cycles_per_second = dStack_438;
      }
    }
    if (chars_read._4_4_ == 0) {
      fprintf(_stderr,"Failed to read num. CPUs correctly from /proc/cpuinfo\n");
    }
    else {
      if (lStack_448 + 1 != (long)chars_read._4_4_) {
        fprintf(_stderr,
                "CPU ID assignments in /proc/cpuinfo seems messed up. This is usually caused by a bad BIOS.\n"
               );
      }
      (anonymous_namespace)::cpuinfo_num_cpus = chars_read._4_4_;
    }
  }
  return;
}

Assistant:

void InitializeSystemInfo() {
#if defined BENCHMARK_OS_LINUX || defined BENCHMARK_OS_CYGWIN
  char line[1024];
  char* err;
  long freq;

  bool saw_mhz = false;

  // If the kernel is exporting the tsc frequency use that. There are issues
  // where cpuinfo_max_freq cannot be relied on because the BIOS may be
  // exporintg an invalid p-state (on x86) or p-states may be used to put the
  // processor in a new mode (turbo mode). Essentially, those frequencies
  // cannot always be relied upon. The same reasons apply to /proc/cpuinfo as
  // well.
  if (!saw_mhz &&
      ReadIntFromFile("/sys/devices/system/cpu/cpu0/tsc_freq_khz", &freq)) {
    // The value is in kHz (as the file name suggests).  For example, on a
    // 2GHz warpstation, the file contains the value "2000000".
    cpuinfo_cycles_per_second = freq * 1000.0;
    saw_mhz = true;
  }

  // If CPU scaling is in effect, we want to use the *maximum* frequency,
  // not whatever CPU speed some random processor happens to be using now.
  if (!saw_mhz &&
      ReadIntFromFile("/sys/devices/system/cpu/cpu0/cpufreq/cpuinfo_max_freq",
                      &freq)) {
    // The value is in kHz.  For example, on a 2GHz warpstation, the file
    // contains the value "2000000".
    cpuinfo_cycles_per_second = freq * 1000.0;
    saw_mhz = true;
  }

  // Read /proc/cpuinfo for other values, and if there is no cpuinfo_max_freq.
  const char* pname = "/proc/cpuinfo";
  int fd = open(pname, O_RDONLY);
  if (fd == -1) {
    perror(pname);
    if (!saw_mhz) {
      cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
    }
    return;
  }

  double bogo_clock = 1.0;
  bool saw_bogo = false;
  long max_cpu_id = 0;
  int num_cpus = 0;
  line[0] = line[1] = '\0';
  size_t chars_read = 0;
  do {  // we'll exit when the last read didn't read anything
    // Move the next line to the beginning of the buffer
    const size_t oldlinelen = strlen(line);
    if (sizeof(line) == oldlinelen + 1)  // oldlinelen took up entire line
      line[0] = '\0';
    else  // still other lines left to save
      memmove(line, line + oldlinelen + 1, sizeof(line) - (oldlinelen + 1));
    // Terminate the new line, reading more if we can't find the newline
    char* newline = strchr(line, '\n');
    if (newline == nullptr) {
      const size_t linelen = strlen(line);
      const size_t bytes_to_read = sizeof(line) - 1 - linelen;
      CHECK(bytes_to_read > 0);  // because the memmove recovered >=1 bytes
      chars_read = read(fd, line + linelen, bytes_to_read);
      line[linelen + chars_read] = '\0';
      newline = strchr(line, '\n');
    }
    if (newline != nullptr) *newline = '\0';

    // When parsing the "cpu MHz" and "bogomips" (fallback) entries, we only
    // accept postive values. Some environments (virtual machines) report zero,
    // which would cause infinite looping in WallTime_Init.
    if (!saw_mhz && strncasecmp(line, "cpu MHz", sizeof("cpu MHz") - 1) == 0) {
      const char* freqstr = strchr(line, ':');
      if (freqstr) {
        cpuinfo_cycles_per_second = strtod(freqstr + 1, &err) * 1000000.0;
        if (freqstr[1] != '\0' && *err == '\0' && cpuinfo_cycles_per_second > 0)
          saw_mhz = true;
      }
    } else if (strncasecmp(line, "bogomips", sizeof("bogomips") - 1) == 0) {
      const char* freqstr = strchr(line, ':');
      if (freqstr) {
        bogo_clock = strtod(freqstr + 1, &err) * 1000000.0;
        if (freqstr[1] != '\0' && *err == '\0' && bogo_clock > 0)
          saw_bogo = true;
      }
    } else if (strncasecmp(line, "processor", sizeof("processor") - 1) == 0) {
      num_cpus++;  // count up every time we see an "processor :" entry
      const char* freqstr = strchr(line, ':');
      if (freqstr) {
        const long cpu_id = strtol(freqstr + 1, &err, 10);
        if (freqstr[1] != '\0' && *err == '\0' && max_cpu_id < cpu_id)
          max_cpu_id = cpu_id;
      }
    }
  } while (chars_read > 0);
  close(fd);

  if (!saw_mhz) {
    if (saw_bogo) {
      // If we didn't find anything better, we'll use bogomips, but
      // we're not happy about it.
      cpuinfo_cycles_per_second = bogo_clock;
    } else {
      // If we don't even have bogomips, we'll use the slow estimation.
      cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
    }
  }
  if (num_cpus == 0) {
    fprintf(stderr, "Failed to read num. CPUs correctly from /proc/cpuinfo\n");
  } else {
    if ((max_cpu_id + 1) != num_cpus) {
      fprintf(stderr,
              "CPU ID assignments in /proc/cpuinfo seems messed up."
              " This is usually caused by a bad BIOS.\n");
    }
    cpuinfo_num_cpus = num_cpus;
  }

#elif defined BENCHMARK_OS_FREEBSD
// For this sysctl to work, the machine must be configured without
// SMP, APIC, or APM support.  hz should be 64-bit in freebsd 7.0
// and later.  Before that, it's a 32-bit quantity (and gives the
// wrong answer on machines faster than 2^32 Hz).  See
//  http://lists.freebsd.org/pipermail/freebsd-i386/2004-November/001846.html
// But also compare FreeBSD 7.0:
//  http://fxr.watson.org/fxr/source/i386/i386/tsc.c?v=RELENG70#L223
//  231         error = sysctl_handle_quad(oidp, &freq, 0, req);
// To FreeBSD 6.3 (it's the same in 6-STABLE):
//  http://fxr.watson.org/fxr/source/i386/i386/tsc.c?v=RELENG6#L131
//  139         error = sysctl_handle_int(oidp, &freq, sizeof(freq), req);
#if __FreeBSD__ >= 7
  uint64_t hz = 0;
#else
  unsigned int hz = 0;
#endif
  size_t sz = sizeof(hz);
  const char* sysctl_path = "machdep.tsc_freq";
  if (sysctlbyname(sysctl_path, &hz, &sz, nullptr, 0) != 0) {
    fprintf(stderr, "Unable to determine clock rate from sysctl: %s: %s\n",
            sysctl_path, strerror(errno));
    cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
  } else {
    cpuinfo_cycles_per_second = hz;
  }
// TODO: also figure out cpuinfo_num_cpus

#elif defined BENCHMARK_OS_WINDOWS
  // In NT, read MHz from the registry. If we fail to do so or we're in win9x
  // then make a crude estimate.
  DWORD data, data_size = sizeof(data);
  if (IsWindowsXPOrGreater() &&
      SUCCEEDED(
          SHGetValueA(HKEY_LOCAL_MACHINE,
                      "HARDWARE\\DESCRIPTION\\System\\CentralProcessor\\0",
                      "~MHz", nullptr, &data, &data_size)))
    cpuinfo_cycles_per_second = static_cast<double>((int64_t)data * (int64_t)(1000 * 1000));  // was mhz
  else
    cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
// TODO: also figure out cpuinfo_num_cpus

#elif defined BENCHMARK_OS_MACOSX
  // returning "mach time units" per second. the current number of elapsed
  // mach time units can be found by calling uint64 mach_absolute_time();
  // while not as precise as actual CPU cycles, it is accurate in the face
  // of CPU frequency scaling and multi-cpu/core machines.
  // Our mac users have these types of machines, and accuracy
  // (i.e. correctness) trumps precision.
  // See cycleclock.h: CycleClock::Now(), which returns number of mach time
  // units on Mac OS X.
  mach_timebase_info_data_t timebase_info;
  mach_timebase_info(&timebase_info);
  double mach_time_units_per_nanosecond =
      static_cast<double>(timebase_info.denom) /
      static_cast<double>(timebase_info.numer);
  cpuinfo_cycles_per_second = mach_time_units_per_nanosecond * 1e9;

  int num_cpus = 0;
  size_t size = sizeof(num_cpus);
  int numcpus_name[] = {CTL_HW, HW_NCPU};
  if (::sysctl(numcpus_name, arraysize(numcpus_name), &num_cpus, &size, nullptr, 0) ==
          0 &&
      (size == sizeof(num_cpus)))
    cpuinfo_num_cpus = num_cpus;

#else
  // Generic cycles per second counter
  cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
#endif
}